

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

int __thiscall
helics::apps::Source::addSignalGenerator(Source *this,string_view name,string_view type)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  bool bVar1;
  size_type sVar2;
  element_type *this_00;
  int iVar3;
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  int index;
  shared_ptr<helics::apps::SignalGenerator> gen;
  shared_ptr<helics::apps::PhasorGenerator> *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffef0;
  
  CLI::std::shared_ptr<helics::apps::SignalGenerator>::shared_ptr
            ((shared_ptr<helics::apps::SignalGenerator> *)0x409659);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
  __x._M_str = in_stack_fffffffffffffef0;
  __x._M_len = (size_t)in_RDI;
  __y._M_str = in_stack_fffffffffffffee0;
  __y._M_len = in_stack_fffffffffffffed8;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    std::
    make_shared<helics::apps::SineGenerator,std::basic_string_view<char,std::char_traits<char>>&>
              (in_RDI);
    std::shared_ptr<helics::apps::SignalGenerator>::operator=
              ((shared_ptr<helics::apps::SignalGenerator> *)
               CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
               (shared_ptr<helics::apps::SineGenerator> *)in_stack_fffffffffffffeb8);
    CLI::std::shared_ptr<helics::apps::SineGenerator>::~shared_ptr
              ((shared_ptr<helics::apps::SineGenerator> *)0x4096f1);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
    __x_00._M_str = in_stack_fffffffffffffef0;
    __x_00._M_len = (size_t)in_RDI;
    __y_00._M_str = in_stack_fffffffffffffee0;
    __y_00._M_len = in_stack_fffffffffffffed8;
    bVar1 = std::operator==(__x_00,__y_00);
    if (bVar1) {
      std::
      make_shared<helics::apps::RampGenerator,std::basic_string_view<char,std::char_traits<char>>&>
                (in_RDI);
      std::shared_ptr<helics::apps::SignalGenerator>::operator=
                ((shared_ptr<helics::apps::SignalGenerator> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (shared_ptr<helics::apps::RampGenerator> *)in_stack_fffffffffffffeb8);
      CLI::std::shared_ptr<helics::apps::RampGenerator>::~shared_ptr
                ((shared_ptr<helics::apps::RampGenerator> *)0x4097b4);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
      __x_01._M_str = in_stack_fffffffffffffef0;
      __x_01._M_len = (size_t)in_RDI;
      __y_01._M_str = in_stack_fffffffffffffee0;
      __y_01._M_len = in_stack_fffffffffffffed8;
      bVar1 = std::operator==(__x_01,__y_01);
      if (!bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8);
        __x_02._M_str = in_stack_fffffffffffffef0;
        __x_02._M_len = (size_t)in_RDI;
        __y_02._M_str = in_stack_fffffffffffffee0;
        __y_02._M_len = in_stack_fffffffffffffed8;
        bVar1 = std::operator==(__x_02,__y_02);
        if (!bVar1) goto LAB_00409894;
      }
      std::
      make_shared<helics::apps::PhasorGenerator,std::basic_string_view<char,std::char_traits<char>>&>
                (in_RDI);
      std::shared_ptr<helics::apps::SignalGenerator>::operator=
                ((shared_ptr<helics::apps::SignalGenerator> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 in_stack_fffffffffffffeb8);
      CLI::std::shared_ptr<helics::apps::PhasorGenerator>::~shared_ptr
                ((shared_ptr<helics::apps::PhasorGenerator> *)0x409890);
    }
  }
LAB_00409894:
  CLI::std::
  vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
  ::push_back((vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
               *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
              (value_type *)in_stack_fffffffffffffeb8);
  in_RDI = in_RDI + 0xf;
  sVar2 = CLI::std::
          vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
          ::size((vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
                  *)in_RDI);
  iVar3 = (int)sVar2 + -1;
  CLI::std::
  vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
  ::back((vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
          *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  this_00 = CLI::std::
            __shared_ptr_access<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4098f0);
  SignalGenerator::getName_abi_cxx11_(this_00);
  std::
  map<std::basic_string_view<char,std::char_traits<char>>,int,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
  ::emplace<std::__cxx11::string_const&,int&>
            ((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
              *)in_RDI,in_stack_fffffffffffffec8,
             (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  CLI::std::shared_ptr<helics::apps::SignalGenerator>::~shared_ptr
            ((shared_ptr<helics::apps::SignalGenerator> *)0x409945);
  return iVar3;
}

Assistant:

int Source::addSignalGenerator(std::string_view name, std::string_view type)
    {
        std::shared_ptr<SignalGenerator> gen;
        if (type == "sine") {
            gen = std::make_shared<SineGenerator>(name);
        } else if (type == "ramp") {
            gen = std::make_shared<RampGenerator>(name);
        } else if ((type == "oscillator") || (type == "phasor")) {
            gen = std::make_shared<PhasorGenerator>(name);
        }
        generators.push_back(std::move(gen));
        auto index = static_cast<int>(generators.size() - 1);
        generatorLookup.emplace(generators.back()->getName(), index);
        return index;
    }